

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_priority_change_req(raft_server *this,req_msg *req)

{
  log_entry *this_00;
  pointer psVar1;
  uint *puVar2;
  _func_int **pp_Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  buffer *this_01;
  size_t sVar7;
  long *plVar8;
  _func_int *p_Var9;
  long *plVar10;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  shared_ptr<nuraft::resp_msg> sVar12;
  ptr<resp_msg> pVar13;
  string local_68;
  ptr<cluster_config> c_conf;
  
  local_68._M_dataplus._M_p = *(pointer *)(in_RDX + 8);
  c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0x19;
  sVar12 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                     ((unsigned_long *)this,(msg_type *)&local_68,(int *)&c_conf,
                      (int *)&req->log_entries_);
  _Var11 = sVar12.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (*(undefined8 **)(in_RDX + 0x40) == *(undefined8 **)(in_RDX + 0x38)) {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 == (pointer)0x0) goto LAB_0019a309;
    iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var11._M_pi = extraout_RDX_01;
    if (iVar4 < 3) goto LAB_0019a309;
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_68,"no log entry");
    (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar1,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
      ,"handle_priority_change_req",0xa2,&local_68);
  }
  else {
    this_00 = (log_entry *)**(undefined8 **)(in_RDX + 0x38);
    if ((this_00->buff_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar1 == (pointer)0x0) goto LAB_0019a309;
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var11._M_pi = extraout_RDX_02;
      if (iVar4 < 3) goto LAB_0019a309;
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_(&local_68,"empty buffer");
      (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar1,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                        ,"handle_priority_change_req",0xa6,&local_68);
    }
    else {
      this_01 = log_entry::get_buf(this_00);
      buffer::pos(this_01,0);
      sVar7 = buffer::size(this_01);
      if (7 < sVar7) {
        uVar5 = buffer::get_int(this_01);
        uVar6 = buffer::get_int(this_01);
        if (uVar5 == *(uint *)&(req->log_entries_).
                               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) {
          *(uint *)((long)&(req->log_entries_).
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) = uVar6;
        }
        get_config((raft_server *)&c_conf);
        plVar8 = (long *)(CONCAT44(c_conf.
                                   super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._4_4_,
                                   c_conf.
                                   super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr._0_4_) + 0x38);
        plVar10 = plVar8;
        do {
          plVar10 = (long *)*plVar10;
          if (plVar10 == plVar8) {
            psVar1 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (psVar1 != (pointer)0x0) {
              iVar4 = (*(code *)(psVar1->
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr[1].buff_.
                                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)();
              if (2 < iVar4) {
                psVar1 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                msg_if_given_abi_cxx11_(&local_68,"cannot find peer %d",(ulong)uVar5);
                (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi)(psVar1,3,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                                  ,"handle_priority_change_req",0xc3,&local_68);
                std::__cxx11::string::~string((string *)&local_68);
              }
            }
            goto LAB_0019a2ff;
          }
          puVar2 = (uint *)plVar10[2];
        } while (*puVar2 != uVar5);
        pp_Var3 = this->_vptr_raft_server;
        p_Var9 = (_func_int *)(**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
        pp_Var3[4] = p_Var9;
        *(undefined1 *)(pp_Var3 + 6) = 1;
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar1 != (pointer)0x0) {
          iVar4 = (*(code *)(psVar1->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
          ;
          if (3 < iVar4) {
            psVar1 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      (&local_68,"change peer %d priority: %d -> %d",(ulong)uVar5,
                       (ulong)puVar2[0x13],(ulong)uVar6);
            (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"handle_priority_change_req",0xbe,&local_68);
            std::__cxx11::string::~string((string *)&local_68);
          }
        }
        puVar2[0x13] = uVar6;
LAB_0019a2ff:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Var11._M_pi = extraout_RDX_04;
        goto LAB_0019a309;
      }
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _Var11._M_pi = extraout_RDX;
      if (psVar1 == (pointer)0x0) goto LAB_0019a309;
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var11._M_pi = extraout_RDX_00;
      if (iVar4 < 3) goto LAB_0019a309;
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar7 = buffer::size(this_01);
      msg_if_given_abi_cxx11_(&local_68,"wrong buffer size: %zu",sVar7);
      (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar1,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                        ,"handle_priority_change_req",0xad,&local_68);
    }
  }
  std::__cxx11::string::~string((string *)&local_68);
  _Var11._M_pi = extraout_RDX_03;
LAB_0019a309:
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_priority_change_req(req_msg& req) {
    // NOTE: now this function is protected by lock.
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::priority_change_response,
            id_,
            req.get_src() ) );

    std::vector< ptr<log_entry> >& v = req.log_entries();
    if (!v.size()) {
        p_wn("no log entry");
        return resp;
    }
    if (v[0]->is_buf_null()) {
        p_wn("empty buffer");
        return resp;
    }

    buffer& buf = v[0]->get_buf();
    buf.pos(0);
    if (buf.size() < sz_int * 2) {
        p_wn("wrong buffer size: %zu", buf.size());
        return resp;
    }

    int32 t_id = buf.get_int();
    int32 t_priority = buf.get_int();

    if (t_id == id_) {
        my_priority_ = t_priority;
    }

    ptr<cluster_config> c_conf = get_config();
    for (auto& entry: c_conf->get_servers()) {
        srv_config* s_conf = entry.get();
        if ( s_conf->get_id() == t_id ) {
            resp->accept(log_store_->next_slot());
            p_in("change peer %d priority: %d -> %d",
                 t_id, s_conf->get_priority(), t_priority);
            s_conf->set_priority(t_priority);
            return resp;
        }
    }
    p_wn("cannot find peer %d", t_id);

    return resp;
}